

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int getBiomeCenters(Pos *pos,int *siz,int nmax,Generator *g,Range r,int match,int minsiz,int tol,
                   char *stop)

{
  Range r_00;
  Range r_01;
  int matchanyLen;
  int dim;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__s;
  int *piVar6;
  int iVar7;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar8;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_00000028;
  char *in_stack_00000030;
  int area;
  Pos center;
  int ii;
  int jj;
  int *cache;
  Range tr;
  BiomeFilter bf;
  int tj;
  int ti;
  int th;
  int tw;
  int tz;
  int tx;
  int ts;
  int p;
  double pz;
  double px;
  DoublePerlinNoise *dpn;
  int *plim;
  int npara;
  int para [5];
  int *lim;
  locate_info_t info;
  int step;
  int *ids;
  int n;
  int k;
  int j;
  int i;
  uint64_t in_stack_fffffffffffffdd0;
  PerlinNoise *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  double in_stack_fffffffffffffde8;
  DoublePerlinNoise *noise;
  int in_stack_fffffffffffffdf8;
  undefined8 local_200;
  int in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int iVar9;
  int in_stack_fffffffffffffe34;
  locate_info_t *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  int *in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  BiomeFilter *in_stack_ffffffffffffff00;
  BiomeFilter *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  int *piVar13;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar14;
  int in_stack_ffffffffffffff58;
  int local_44;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  noise = (DoublePerlinNoise *)&stack0x00000008;
  local_28 = in_R9D;
  if (in_R9D < 1) {
    local_28 = 1;
  }
  local_38 = 0;
  __s = malloc((long)(in_stack_00000014 * in_stack_00000018) << 2);
  memset(__s,0xff,(long)(*(int *)&(noise->octA).field_0x4 * *(int *)&(noise->octA).octaves) << 2);
  if (in_stack_00000028 < 1) {
    in_stack_00000028 = 1;
  }
  local_44 = in_stack_00000028;
  if (*in_RCX < 0x16) {
    iVar14 = (int)(0x20 / (long)*(int *)&noise->amplitude);
    if (*(int *)&(noise->octA).field_0x4 + *(int *)&(noise->octA).octaves < 0x20) {
      iVar14 = 8;
    }
    dVar8 = floor((double)*(int *)((long)&noise->amplitude + 4) / (double)iVar14);
    iVar7 = (int)dVar8;
    dVar8 = floor((double)(noise->octA).octcnt / (double)iVar14);
    matchanyLen = (int)dVar8;
    dVar8 = ceil((double)(*(int *)((long)&noise->amplitude + 4) + *(int *)&(noise->octA).field_0x4)
                 / (double)iVar14);
    dim = (int)dVar8 - iVar7;
    dVar8 = ceil((double)((noise->octA).octcnt + *(int *)&(noise->octA).octaves) / (double)iVar14);
    iVar1 = (int)dVar8 - matchanyLen;
    setupBiomeFilter(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
                     in_stack_ffffffffffffff10,(int *)CONCAT44(dim,iVar1),matchanyLen);
    in_stack_fffffffffffffe2c = 0;
    in_stack_fffffffffffffe30 = 1;
    in_stack_fffffffffffffdd0 = *(uint64_t *)&noise->octA;
    in_stack_fffffffffffffdd8 = (noise->octA).octaves;
    in_stack_fffffffffffffde0 = (noise->octB).octcnt;
    r_00.x = in_stack_fffffffffffffde4;
    r_00.scale = in_stack_fffffffffffffde0;
    r_00._8_8_ = in_stack_fffffffffffffde8;
    r_00._16_8_ = noise;
    r_00.sy = in_stack_fffffffffffffdf8;
    in_stack_fffffffffffffe28 = iVar14;
    iVar12 = iVar14;
    piVar6 = allocCache((Generator *)noise->amplitude,r_00);
    for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
      iVar11 = 0;
      while ((iVar11 < dim && ((in_stack_00000030 == (char *)0x0 || (*in_stack_00000030 == '\0')))))
      {
        iVar2 = (iVar7 + iVar11) * iVar12;
        iVar3 = (matchanyLen + iVar10) * iVar12;
        in_stack_fffffffffffffdd0 = CONCAT44(iVar14,iVar3);
        in_stack_fffffffffffffdd8 =
             (PerlinNoise *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
        r_01.z = (int)in_stack_ffffffffffffff48;
        r_01.sx = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
        r_01.scale = (int)in_stack_ffffffffffffff40;
        r_01.x = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        r_01.sz = in_stack_ffffffffffffff50;
        r_01.y = in_stack_ffffffffffffff54;
        r_01.sy = in_stack_ffffffffffffff58;
        iVar9 = in_stack_fffffffffffffe30;
        iVar4 = checkForBiomes((Generator *)CONCAT44(in_stack_ffffffffffffff2c,iVar12),
                               (int *)CONCAT44(iVar7,matchanyLen),r_01,dim,CONCAT44(iVar11,iVar10),
                               in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
        if (iVar4 == 1) {
          for (local_30 = 0; local_30 < iVar12; local_30 = local_30 + 1) {
            iVar4 = (iVar3 + local_30) - (noise->octA).octcnt;
            if ((-1 < iVar4) && (iVar4 < *(int *)&(noise->octA).octaves)) {
              for (local_2c = 0; local_2c < iVar12; local_2c = local_2c + 1) {
                iVar5 = (iVar2 + local_2c) - *(int *)((long)&noise->amplitude + 4);
                if ((-1 < iVar5) && (iVar5 < *(int *)&(noise->octA).field_0x4)) {
                  *(int *)((long)__s + (long)(iVar4 * *(int *)&(noise->octA).field_0x4 + iVar5) * 4)
                       = piVar6[local_30 * iVar14 + local_2c];
                }
              }
            }
          }
        }
        iVar11 = iVar11 + 1;
        in_stack_fffffffffffffde0 = in_stack_fffffffffffffe30;
        in_stack_fffffffffffffe30 = iVar9;
      }
    }
    free(piVar6);
    local_24 = in_R8D;
  }
  else {
    piVar6 = getBiomeParaLimits(*in_RCX,in_R8D);
    iVar14 = 5;
    if (in_stack_00000028 == 1) {
      dVar8 = sqrt((double)local_28);
      dVar8 = floor(dVar8 * 0.5);
      local_44 = (int)(dVar8 + 1.0);
    }
    for (local_30 = 0; local_30 < *(int *)&(noise->octA).octaves; local_30 = local_44 + local_30) {
      local_2c = 0;
      while ((local_2c < *(int *)&(noise->octA).field_0x4 &&
             ((in_stack_00000030 == (char *)0x0 || (*in_stack_00000030 == '\0'))))) {
        for (local_34 = 0; local_34 < iVar14; local_34 = local_34 + 1) {
          piVar13 = piVar6 + (*(int *)(&stack0xffffffffffffff58 + (long)local_34 * 4) << 1);
          if ((*piVar13 != -0x80000000) || (piVar13[1] != 0x7fffffff)) {
            dVar8 = sampleDoublePerlin(noise,in_stack_fffffffffffffde8,
                                       (double)CONCAT44(in_stack_fffffffffffffde4,
                                                        in_stack_fffffffffffffde0),
                                       (double)in_stack_fffffffffffffdd8);
            if (((int)(dVar8 * 10000.0) < *piVar13) || (piVar13[1] < (int)(dVar8 * 10000.0))) {
              *(undefined4 *)
               ((long)__s + (long)(local_30 * *(int *)&(noise->octA).field_0x4 + local_2c) * 4) =
                   0xfffffffe;
              break;
            }
          }
        }
        local_2c = local_44 + local_2c;
      }
    }
    local_24 = -1;
  }
  applySeed((Generator *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
            (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),in_stack_fffffffffffffdd0);
  for (local_30 = 0; local_30 < *(int *)&(noise->octA).octaves; local_30 = local_44 + local_30) {
    local_2c = 0;
    while ((local_2c < *(int *)&(noise->octA).field_0x4 &&
           ((in_stack_00000030 == (char *)0x0 || (*in_stack_00000030 == '\0'))))) {
      if ((*(int *)((long)__s + (long)(local_30 * *(int *)&(noise->octA).field_0x4 + local_2c) * 4)
           == local_24) &&
         (iVar14 = floodFillGen(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                                in_stack_fffffffffffffe30,
                                (Pos *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                               ), local_28 <= iVar14)) {
        *(undefined8 *)(in_RDI + (long)local_38 * 8) = local_200;
        if (in_RSI != 0) {
          *(int *)(in_RSI + (long)local_38 * 4) = iVar14;
        }
        local_38 = local_38 + 1;
        if (in_EDX <= local_38) goto LAB_001175b4;
      }
      local_2c = local_44 + local_2c;
    }
  }
LAB_001175b4:
  free(__s);
  return local_38;
}

Assistant:

int getBiomeCenters(Pos *pos, int *siz, int nmax, Generator *g, Range r,
    int match, int minsiz, int tol, volatile char *stop)
{
    if (minsiz <= 0)
        minsiz = 1;
    int i, j, k, n = 0;
    int *ids = (int*) malloc(r.sx*r.sz * sizeof(int));
    memset(ids, -1, r.sx*r.sz * sizeof(int));
    if (tol <= 0)
        tol = 1;
    int step = tol;
    struct locate_info_t info;
    info.g = g;
    info.ids = ids;
    info.r = r;
    info.stop = stop;
    info.match = match;
    info.tol = tol;

    if (g->mc >= MC_1_18)
    {
        const int *lim = getBiomeParaLimits(g->mc, match);

        int para[] = {
            NP_TEMPERATURE,
            NP_HUMIDITY,
            NP_EROSION,
            NP_CONTINENTALNESS,
            NP_WEIRDNESS,
        };
        int npara = sizeof(para) / sizeof(para[0]);
        if (tol == 1)
            step = 1 + floor(sqrt(minsiz) * 0.5);

        for (j = 0; j < r.sz; j += step)
        {
            for (i = 0; i < r.sx; i += step)
            {
                if (stop && *stop)
                    break;
                for (k = 0; k < npara; k++)
                {
                    const int *plim = lim + 2*para[k];
                    if (plim[0] == INT_MIN && plim[1] == INT_MAX)
                        continue;
                    DoublePerlinNoise *dpn = &g->bn.climate[para[k]];
                    double px = (r.x+i) * r.scale / 4.0;
                    double pz = (r.z+j) * r.scale / 4.0;
                    int p = 10000 * sampleDoublePerlin(dpn, px, 0, pz);
                    if (p < plim[0] || p > plim[1])
                    {
                        ids[j*r.sx + i] = -2;
                        break;
                    }
                }
            }
        }
        match = -1; // id entries that are still -1 are our candidates
    }
    else // 1.17-
    {
        int ts = 32 / r.scale;
        if (r.sx + r.sz < 32)
            ts = 8;

        int tx = (int) floor(r.x / (double)ts);
        int tz = (int) floor(r.z / (double)ts);
        int tw = (int) ceil((r.x+r.sx) / (double)ts) - tx;
        int th = (int) ceil((r.z+r.sz) / (double)ts) - tz;
        int ti, tj;

        BiomeFilter bf;
        setupBiomeFilter(&bf, g->mc, 0, &match, 1, 0, 0, 0, 0);
        //applySeed(g, 0, g->seed);

        Range tr = { r.scale, 0, 0, ts, ts, 0, 1 };
        int *cache = allocCache(g, r);

        for (tj = 0; tj < th; tj++)
        {
            for (ti = 0; ti < tw; ti++)
            {
                if (stop && *stop)
                    break;
                tr.x = (tx+ti) * ts;
                tr.z = (tz+tj) * ts;
                if (checkForBiomes(g, cache, tr, DIM_OVERWORLD, g->seed,
                    &bf, stop) != 1)
                {
                    continue;
                }
                for (j = 0; j < ts; j++)
                {
                    int jj = tr.z + j - r.z;
                    if (jj < 0 || jj >= r.sz)
                        continue;
                    for (i = 0; i < ts; i++)
                    {
                        int ii = tr.x + i - r.x;
                        if (ii < 0 || ii >= r.sx)
                            continue;
                        ids[jj*r.sx + ii] = cache[j*tr.sx + i];
                    }
                }
            }
        }
        free(cache);
    }

    applySeed(g, DIM_OVERWORLD, g->seed);
    for (j = 0; j < r.sz; j += step)
    {
        for (i = 0; i < r.sx; i += step)
        {
            if (stop && *stop)
                break;
            if (ids[j*r.sx + i] != match)
                continue;
            Pos center;
            int area = floodFillGen(&info, i, j, &center);
            if (area >= minsiz)
            {
                pos[n] = center;
                if (siz) siz[n] = area;
                if (++n >= nmax)
                    goto L_end;
            }
        }
    }

L_end:
    free(ids);

    return n;
}